

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

string * tinyusdz::unescapeBackslash(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  string bs_unescaped;
  string bs;
  allocator local_61;
  allocator local_60 [32];
  string local_40 [8];
  string *local_38;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  ::std::__cxx11::string::string(local_40,"\\\\",local_60);
  ::std::__cxx11::string::string((string *)local_60,"\\",&local_61);
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_40);
    if (uVar1 == 0xffffffffffffffff) break;
    ::std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,local_38);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeBackslash(const std::string &str) {
  std::string s = str;

  std::string bs = "\\\\";
  std::string bs_unescaped = "\\";

  std::string::size_type pos = 0;
  while ((pos = s.find(bs, pos)) != std::string::npos) {
    s.replace(pos, bs.length(), bs_unescaped);
    pos += bs_unescaped.length();
  }

  return s;
}